

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict
sexp_get_opcode_data(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  sexp psVar1;
  sexp_conflict psVar2;
  long lVar3;
  
  if ((((ulong)op & 3) == 0) && (op->tag == 0x1b)) {
    psVar2 = (sexp_conflict)(op->value).fileno.fd;
    if (psVar2 != (sexp_conflict)0x0) {
      if ((((op->value).flonum_bits[0x58] == '\x02') && (lVar3 = (long)psVar2 >> 1, -1 < lVar3)) &&
         (psVar1 = (ctx->value).type.setters, lVar3 <= (long)(psVar1->value).type.id >> 1)) {
        psVar2 = *(sexp_conflict *)((long)&((psVar1->value).type.getters)->value + lVar3 * 8 + 8);
      }
      return psVar2;
    }
    return (sexp_conflict)0x43e;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x1b);
  return psVar2;
}

Assistant:

sexp sexp_get_opcode_data (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  sexp data;
  sexp_assert_type(ctx, sexp_opcodep, SEXP_OPCODE, op);
  data = sexp_opcode_data(op);
  if (!data) return SEXP_VOID;
  return sexp_opcode_class(op) == SEXP_OPC_TYPE_PREDICATE
    && 0 <= sexp_unbox_fixnum(data)
    && sexp_unbox_fixnum(data) <= sexp_context_num_types(ctx) ?
    sexp_type_by_index(ctx, sexp_unbox_fixnum(data)) : data;
}